

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.cpp
# Opt level: O1

void duckdb::DiscreteAverageOperation::Finalize<long,duckdb::AvgState<duckdb::hugeint_t>>
               (AvgState<duckdb::hugeint_t> *state,long *target,AggregateFinalizeData *finalize_data
               )

{
  hugeint_t rhs;
  bool bVar1;
  hugeint_t hVar2;
  hugeint_t input;
  long result;
  hugeint_t remainder;
  hugeint_t local_58;
  hugeint_t local_48;
  hugeint_t local_38;
  
  if (state->count != 0) {
    hVar2 = state->value;
    hugeint_t::hugeint_t(&local_48,state->count);
    rhs.upper = local_48.upper;
    rhs.lower = local_48.lower;
    hVar2 = Hugeint::DivMod(hVar2,rhs,&local_38);
    local_58.lower = 0;
    input.upper = (int64_t)&local_58;
    input.lower = hVar2.upper;
    Hugeint::TryCast<long>((Hugeint *)hVar2.lower,input,(int64_t *)local_48.upper);
    *target = local_58.lower;
    hugeint_t::hugeint_t(&local_58,state->count >> 1);
    bVar1 = hugeint_t::operator>(&local_38,&local_58);
    *target = *target + (ulong)bVar1;
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.count == 0) {
			finalize_data.ReturnNull();
		} else {
			hugeint_t remainder;
			target = Hugeint::Cast<T>(Hugeint::DivMod(state.value, state.count, remainder));
			// Round the result
			target += (remainder > (state.count / 2));
		}
	}